

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weight_constraint.cpp
# Opt level: O0

void __thiscall Clasp::WeightConstraint::undoLevel(WeightConstraint *this,Solver *s)

{
  ValueRep VVar1;
  bool bVar2;
  uint uVar3;
  uint32 uVar4;
  ActiveConstraint AVar5;
  undefined8 in_RSI;
  WeightConstraint *in_RDI;
  uint32 end;
  uint32 i;
  ActiveConstraint other;
  UndoInfo u;
  uint32 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  weight_t in_stack_ffffffffffffffb4;
  undefined8 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffcc;
  uint32 local_20;
  UndoInfo local_14;
  undefined8 local_10;
  
  local_10 = in_RSI;
  setBpIndex((WeightConstraint *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffac);
  UndoInfo::UndoInfo(&local_14,0);
  while( true ) {
    uVar3 = *(uint *)&in_RDI->field_0x10 & 0x7ffffff;
    uVar4 = undoStart((WeightConstraint *)0x218004);
    in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc & 0xffffff;
    if (uVar3 != uVar4) {
      in_stack_ffffffffffffffc0 = local_10;
      local_14 = undoTop(in_RDI);
      UndoInfo::idx(&local_14);
      WL::var((WL *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
              in_stack_ffffffffffffffac);
      VVar1 = Solver::value((Solver *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            in_stack_ffffffffffffffac);
      in_stack_ffffffffffffffcc = CONCAT13(VVar1 == '\0',(int3)in_stack_ffffffffffffffcc);
    }
    if ((char)(in_stack_ffffffffffffffcc >> 0x18) == '\0') break;
    uVar4 = UndoInfo::idx(&local_14);
    toggleLitSeen(in_RDI,uVar4);
    UndoInfo::idx(&local_14);
    in_stack_ffffffffffffffb4 =
         weight((WeightConstraint *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                in_stack_ffffffffffffffac);
    AVar5 = UndoInfo::constraint(&local_14);
    in_RDI->bound_[AVar5] = in_stack_ffffffffffffffb4 + in_RDI->bound_[AVar5];
    *(uint *)&in_RDI->field_0x10 =
         *(uint *)&in_RDI->field_0x10 & 0xf8000000 |
         (*(uint *)&in_RDI->field_0x10 & 0x7ffffff) - 1 & 0x7ffffff;
  }
  bVar2 = litSeen(in_RDI,0);
  if ((!bVar2) &&
     (*(uint *)&in_RDI->field_0x10 = *(uint *)&in_RDI->field_0x10 & 0xcfffffff | 0x30000000,
     *(uint *)&in_RDI->field_0x10 >> 0x1e < 2)) {
    local_20 = 1;
    uVar4 = size((WeightConstraint *)0x21813f);
    for (; local_20 != uVar4; local_20 = local_20 + 1) {
      addWatch(in_RDI,(Solver *)CONCAT44(in_stack_ffffffffffffffcc,uVar3),
               (uint32)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
               (ActiveConstraint)in_stack_ffffffffffffffc0);
    }
    *(uint *)&in_RDI->field_0x10 = *(uint *)&in_RDI->field_0x10 & 0x3fffffff | 0xc0000000;
  }
  return;
}

Assistant:

void WeightConstraint::undoLevel(Solver& s) {
	setBpIndex(1);
	for (UndoInfo u; up_ != undoStart() && s.value(lits_->var((u=undoTop()).idx())) == value_free;) {
		assert(litSeen(u.idx()));
		toggleLitSeen(u.idx());
		bound_[u.constraint()] += weight(u.idx());
		--up_;
	}
	if (!litSeen(0)) {
		active_ = NOT_ACTIVE;
		if (watched_ < 2u) {
			ActiveConstraint other = static_cast<ActiveConstraint>(watched_^1);
			for (uint32 i = 1, end = size(); i != end; ++i) {
				addWatch(s, i, other);
			}
			watched_ = 3u;
		}
	}
}